

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O1

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::flush_output
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this,int param_1)

{
  VIAPortHandler *pVVar1;
  DeferredAudio *queue;
  HalfCycles HVar2;
  long lVar3;
  
  HVar2.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)(this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_
  ;
  (this->time_since_video_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  Macintosh::Video::run_for(&this->video_,HVar2);
  HVar2 = Macintosh::Video::next_sequence_point(&this->video_);
  (this->time_until_video_event_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)HVar2.super_WrappedInt<HalfCycles>.length_;
  pVVar1 = (this->via_).bus_handler_;
  lVar3 = (this->via_).time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_;
  (this->via_).time_since_bus_handler_call_.super_WrappedInt<HalfCycles>.length_ = 0;
  queue = pVVar1->audio_;
  lVar3 = lVar3 * 5 + (queue->time_since_update).super_WrappedInt<HalfCycles>.length_;
  (queue->time_since_update).super_WrappedInt<HalfCycles>.length_ = (ulong)((uint)lVar3 & 1);
  Outputs::Speaker::PullLowpass<Apple::Macintosh::Audio>::run_for
            (&queue->speaker,&queue->queue,(Cycles)(lVar3 >> 1));
  if ((this->audio_).queue.actions_.
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->audio_).queue.actions_.
      super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::condition_variable::notify_all();
  }
  if ((this->iwm_).is_flushed_ != false) {
    return;
  }
  (this->iwm_).is_flushed_ = true;
  (this->iwm_).did_flush_ = true;
  lVar3 = (this->iwm_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
  (this->iwm_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = (ulong)((uint)lVar3 & 1);
  IWM::run_for(&(this->iwm_).object_,(Cycles)(lVar3 >> 1));
  return;
}

Assistant:

void flush_output(int) {
			// Flush the video before the audio queue; in a Mac the
			// video is responsible for providing part of the
			// audio signal, so the two aren't as distinct as in
			// most machines.
			update_video();

			// As above: flush audio after video.
			via_.flush();
			audio_.queue.perform();

			// This avoids deferring IWM costs indefinitely, until
			// they become artbitrarily large.
			iwm_.flush();
		}